

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

Function * __thiscall
dg::llvmdg::legacy::GraphBuilder::buildFunction
          (GraphBuilder *this,Function *llvmFunction,bool recursively)

{
  StronglyConnectedComponent *component;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  Function *pFVar4;
  Block *pBVar5;
  mapped_type *pmVar6;
  mapped_type *ppBVar7;
  Block *successor;
  Block *successor_00;
  _Base_ptr p_Var8;
  BasicBlock *__range3;
  BasicBlock *pBVar9;
  int __status;
  Block *successor_01;
  Function *pFVar10;
  BasicBlock *instruction;
  Function *pFVar11;
  Function *pFVar12;
  BasicBlock *pBVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_bool>
  pVar14;
  const_succ_iterator cVar15;
  bool createBlock;
  bool createCallReturn;
  Block *lastBlock;
  _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_180;
  Function *local_178;
  Function *llvmFunction_local;
  Function *local_168;
  Function *local_160;
  GraphBuilder *local_158;
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  local_150;
  TarjanAnalysis<dg::llvmdg::legacy::Block> tarjan;
  map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
  instToBlockMap;
  
  if (llvmFunction != (Function *)0x0) {
    llvmFunction_local = llvmFunction;
    iVar3 = std::
            _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
            ::find(&(this->_functions)._M_t,&llvmFunction_local);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->_functions)._M_t._M_impl.super__Rb_tree_header)
    {
      pFVar4 = (Function *)operator_new(0x40);
      Function::Function(pFVar4);
      tarjan._0_8_ = pFVar4;
      pVar14 = std::
               _Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>,std::_Select1st<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>>
               ::_M_emplace_unique<llvm::Function_const*&,dg::llvmdg::legacy::Function*>
                         ((_Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>,std::_Select1st<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>>
                           *)&this->_functions,&llvmFunction_local,(Function **)&tarjan);
      local_178 = (Function *)pVar14.first._M_node._M_node[1]._M_parent;
      instToBlockMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &instToBlockMap._M_t._M_impl.super__Rb_tree_header._M_header;
      instToBlockMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      instToBlockMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      instToBlockMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lastBlock = (Block *)0x0;
      pFVar12 = llvmFunction_local + 0x48;
      local_180 = (_Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->_mapping;
      local_168 = pFVar12;
      local_158 = this;
      instToBlockMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           instToBlockMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (pFVar11 = llvmFunction_local + 0x50; pFVar11 = *(Function **)pFVar11, pFVar11 != pFVar12;
          pFVar11 = pFVar11 + 8) {
        pBVar9 = (BasicBlock *)(pFVar11 + -0x18);
        if (pFVar11 == (Function *)0x0) {
          pBVar9 = (BasicBlock *)0x0;
        }
        bVar1 = isReachable(pBVar9);
        if (bVar1) {
          createBlock = true;
          local_160 = pFVar11;
          for (pBVar13 = pBVar9 + 0x30; pBVar13 = *(BasicBlock **)pBVar13, pFVar11 = local_160,
              pFVar12 = local_168, pBVar13 != pBVar9 + 0x28; pBVar13 = pBVar13 + 8) {
            instruction = pBVar13 + -0x18;
            if (pBVar13 == (BasicBlock *)0x0) {
              instruction = (BasicBlock *)0x0;
            }
            if (createBlock == true) {
              pBVar5 = (Block *)operator_new(0x118);
              Block::Block(pBVar5,pBVar9,false);
              local_150._M_impl._0_8_ = pBVar9;
              tarjan._0_8_ = pBVar5;
              pmVar6 = std::__detail::
                       _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_180,(key_type *)&local_150);
              std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              ::push_back(pmVar6,(value_type *)&tarjan);
              Function::addBlock(local_178,(Block *)tarjan._0_8_);
              if ((lastBlock != (Block *)0x0) && (lastBlock->_llvm_blk == pBVar9)) {
                Block::addSuccessor(lastBlock,(Block *)tarjan._0_8_);
              }
              lastBlock = (Block *)tarjan._0_8_;
              createBlock = false;
            }
            createCallReturn = false;
            if ((recursively) && (((Instruction *)instruction)[0x10] == (Instruction)0x53)) {
              handleCallInstruction
                        (local_158,(Instruction *)instruction,lastBlock,&createBlock,
                         &createCallReturn);
              bVar1 = createCallReturn;
              Block::addInstruction(lastBlock,(Instruction *)instruction);
              tarjan._0_8_ = instruction;
              std::
              _Rb_tree<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>,std::_Select1st<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>>
              ::_M_emplace_unique<llvm::Instruction_const*,dg::llvmdg::legacy::Block*&>
                        ((_Rb_tree<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>,std::_Select1st<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>>
                          *)&instToBlockMap,(Instruction **)&tarjan,&lastBlock);
              if ((bVar1 & 1U) != 0) {
                pBVar5 = (Block *)operator_new(0x118);
                Block::Block(pBVar5,pBVar9,true);
                local_150._M_impl._0_8_ = pBVar9;
                tarjan._0_8_ = pBVar5;
                pmVar6 = std::__detail::
                         _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[](local_180,(key_type *)&local_150);
                std::
                vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>::
                push_back(pmVar6,(value_type *)&tarjan);
                Function::addBlock(local_178,(Block *)tarjan._0_8_);
                Block::addSuccessor(lastBlock,(Block *)tarjan._0_8_);
                lastBlock = (Block *)tarjan._0_8_;
                createBlock = true;
              }
            }
            else {
              Block::addInstruction(lastBlock,(Instruction *)instruction);
              tarjan._0_8_ = instruction;
              std::
              _Rb_tree<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>,std::_Select1st<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>>
              ::_M_emplace_unique<llvm::Instruction_const*,dg::llvmdg::legacy::Block*&>
                        ((_Rb_tree<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>,std::_Select1st<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>>
                          *)&instToBlockMap,(Instruction **)&tarjan,&lastBlock);
            }
          }
        }
      }
      local_180 = (_Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)(llvmFunction_local + 0x48);
      for (pFVar11 = llvmFunction_local + 0x50; pFVar4 = local_178, pFVar11 = *(Function **)pFVar11,
          pFVar11 != (Function *)local_180; pFVar11 = pFVar11 + 8) {
        pBVar9 = (BasicBlock *)(pFVar11 + -0x18);
        if (pFVar11 == (Function *)0x0) {
          pBVar9 = (BasicBlock *)0x0;
        }
        bVar1 = isReachable(pBVar9);
        if (bVar1) {
          tarjan._0_8_ = *(long *)(pBVar9 + 0x28) + -0x18;
          if (*(long *)(pBVar9 + 0x28) == 0) {
            tarjan._0_8_ = 0;
          }
          successor_01 = (Block *)&tarjan;
          ppBVar7 = std::
                    map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                    ::operator[](&instToBlockMap,(key_type *)&tarjan);
          pBVar5 = *ppBVar7;
          cVar15 = llvm::succ_begin(pBVar9);
          while( true ) {
            tarjan._0_8_ = cVar15.Inst;
            __status = (int)successor_01;
            tarjan.stack.c.
            super__Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
            ._M_impl.super__Deque_impl_data._M_map._0_4_ = cVar15.Idx;
            cVar15 = llvm::succ_end(pBVar9);
            if ((int)tarjan.stack.c.
                     super__Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                     ._M_impl.super__Deque_impl_data._M_map == cVar15.Idx) break;
            pBVar13 = llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>::operator*
                                ((SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> *)
                                 &tarjan);
            local_150._M_impl._0_8_ = *(long *)(pBVar13 + 0x30) + -0x18;
            if (*(long *)(pBVar13 + 0x30) == 0) {
              local_150._M_impl._0_8_ = (BasicBlock *)0x0;
            }
            ppBVar7 = std::
                      map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                      ::operator[](&instToBlockMap,(key_type *)&local_150);
            successor_01 = *ppBVar7;
            Block::addSuccessor(pBVar5,successor_01);
            cVar15.Idx = (int)tarjan.stack.c.
                              super__Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                              ._M_impl.super__Deque_impl_data._M_map + 1;
            cVar15.Inst = (Instruction *)tarjan._0_8_;
            cVar15._12_4_ = 0;
          }
          iVar2 = successorsNumber(pBVar9);
          if (iVar2 == 0) {
            Function::exit(local_178,__status);
            Block::addSuccessor(pBVar5,successor);
          }
        }
      }
      Function::nodes((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                       *)&local_150,local_178);
      TarjanAnalysis<dg::llvmdg::legacy::Block>::TarjanAnalysis
                (&tarjan,local_150._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
      ::~_Rb_tree(&local_150);
      pBVar5 = Function::entry(pFVar4);
      TarjanAnalysis<dg::llvmdg::legacy::Block>::compute(&tarjan,pBVar5);
      TarjanAnalysis<dg::llvmdg::legacy::Block>::computeCondensation(&tarjan);
      for (p_Var8 = tarjan.components_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &tarjan.components_._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        component = *(StronglyConnectedComponent **)(p_Var8 + 1);
        pFVar10 = pFVar4;
        bVar1 = isExit(component,pFVar4);
        if ((!bVar1) &&
           ((component->successors_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
          pBVar5 = (component->nodes_).
                   super__Vector_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
          Function::exit(pFVar4,(int)pFVar10);
          Block::addSuccessor(pBVar5,successor_00);
        }
      }
      TarjanAnalysis<dg::llvmdg::legacy::Block>::~TarjanAnalysis(&tarjan);
      std::
      _Rb_tree<const_llvm::Instruction_*,_std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>,_std::_Select1st<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
      ::~_Rb_tree(&instToBlockMap._M_t);
      return pFVar4;
    }
  }
  return (Function *)0x0;
}

Assistant:

Function *GraphBuilder::buildFunction(const llvm::Function *llvmFunction,
                                      bool recursively) {
    if (!llvmFunction) {
        return nullptr;
    }
    auto iterator = _functions.find(llvmFunction);
    if (iterator != _functions.end()) {
        return nullptr;
    }
    iterator = _functions.emplace(llvmFunction, new Function()).first;
    Function *function = iterator->second;

    std::map<const llvm::Instruction *, Block *> instToBlockMap;
    Block *lastBlock = nullptr;
    for (const auto &llvmBlock : *llvmFunction) {
        if (!isReachable(&llvmBlock)) {
            continue;
        }

        bool createBlock = true;
        for (const auto &llvmInst : llvmBlock) {
            if (createBlock) {
                auto *tmpBlock = new Block(&llvmBlock);
                _mapping[&llvmBlock].push_back(tmpBlock);
                function->addBlock(tmpBlock);
                if (lastBlock) {
                    if (lastBlock->llvmBlock() == &llvmBlock) {
                        lastBlock->addSuccessor(tmpBlock);
                    }
                }
                lastBlock = tmpBlock;
                createBlock = false;
            }
            bool createCallReturn = false;
            if (recursively &&
                llvmInst.getOpcode() == llvm::Instruction::Call) {
                handleCallInstruction(&llvmInst, lastBlock, createBlock,
                                      createCallReturn);
            }
            lastBlock->addInstruction(&llvmInst);
            instToBlockMap.emplace(&llvmInst, lastBlock);

            if (createCallReturn) {
                auto *tmpBlock = new Block(&llvmBlock, createCallReturn);
                _mapping[&llvmBlock].push_back(tmpBlock);
                function->addBlock(tmpBlock);
                lastBlock->addSuccessor(tmpBlock);
                lastBlock = tmpBlock;
                createBlock = true;
            }
        }
    }

    for (const auto &llvmBlock : *llvmFunction) {
        if (isReachable(&llvmBlock)) {
            auto *block = instToBlockMap[&llvmBlock.back()];
            for (auto succ = llvm::succ_begin(&llvmBlock);
                 succ != llvm::succ_end(&llvmBlock); ++succ) {
                auto *succ_block = instToBlockMap[&succ->front()];
                block->addSuccessor(succ_block);
            }
            if (successorsNumber(&llvmBlock) == 0) {
                block->addSuccessor(function->exit());
            }
        }
    }

    TarjanAnalysis<Block> tarjan(function->nodes().size());
    tarjan.compute(function->entry());
    tarjan.computeCondensation();
    const auto &componentss = tarjan.components();
    for (auto *const component : componentss) {
        if (!isExit(component, function) && component->successors().empty()) {
            component->nodes().back()->addSuccessor(function->exit());
        }
    }

    //    auto components =
    //    tarjan.computeBackWardReachability(function->exit());

    //    for (auto component : components) {
    //        if (component->nodes().size() > 1 ||
    //            component->successors().find(component) !=
    //            component->successors().end()) {
    //            component->nodes().back()->addSuccessor(function->exit());
    //        }
    //    }

    return function;
}